

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrame.h
# Opt level: O2

ChFrame<double> * __thiscall
chrono::ChFrame<double>::operator>>=(ChFrame<double> *this,ChQuaternion<double> *R)

{
  ChVector<double> CStack_58;
  ChQuaternion<double> local_40;
  
  ChQuaternion<double>::Rotate(R,&(this->coord).pos);
  ChQuaternion<double>::operator>>(&local_40,&(this->coord).rot,R);
  SetCoord(this,&CStack_58,&local_40);
  return this;
}

Assistant:

ChFrame<Real>& operator>>=(const ChQuaternion<Real>& R) {
        this->SetCoord(R.Rotate(this->coord.pos), this->coord.rot >> R);
        return *this;
    }